

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O0

void __thiscall DIS::AggregateStatePdu::marshal(AggregateStatePdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  undefined1 local_c0 [8];
  VariableDatum x_4;
  size_t idx_4;
  EntityType x_3;
  size_t idx_3;
  EntityType x_2;
  size_t idx_2;
  EntityID x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  AggregateID x;
  size_t idx;
  DataStream *dataStream_local;
  AggregateStatePdu *this_local;
  
  EntityManagementFamilyPdu::marshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::marshal(&this->_aggregateID,dataStream);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<(dataStream,this->_aggregateState);
  EntityType::marshal(&this->_aggregateType,dataStream);
  DataStream::operator<<(dataStream,this->_formation);
  AggregateMarking::marshal(&this->_aggregateMarking,dataStream);
  Vector3Float::marshal(&this->_dimensions,dataStream);
  Orientation::marshal(&this->_orientation,dataStream);
  Vector3Double::marshal(&this->_centerOfMass,dataStream);
  Vector3Float::marshal(&this->_velocity,dataStream);
  sVar2 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::size
                    (&this->_aggregateIDList);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  sVar2 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::size(&this->_entityIDList);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                    (&this->_silentAggregateSystemList);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                    (&this->_silentEntitySystemList);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  x._site = 0;
  x._application = 0;
  x._aggregateID = 0;
  x._14_2_ = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::size
                      (&this->_aggregateIDList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::operator[]
                       (&this->_aggregateIDList,x._8_8_);
    AggregateID::AggregateID((AggregateID *)local_30,pvVar3);
    AggregateID::marshal((AggregateID *)local_30,dataStream);
    AggregateID::~AggregateID((AggregateID *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._site = 0;
  x_1._application = 0;
  x_1._entity = 0;
  x_1._14_2_ = 0;
  while( true ) {
    uVar1 = x_1._8_8_;
    sVar2 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::size(&this->_entityIDList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::operator[]
                       (&this->_entityIDList,x_1._8_8_);
    EntityID::EntityID((EntityID *)&idx_2,pvVar4);
    EntityID::marshal((EntityID *)&idx_2,dataStream);
    EntityID::~EntityID((EntityID *)&idx_2);
    x_1._8_8_ = x_1._8_8_ + 1;
  }
  DataStream::operator<<(dataStream,this->_pad2);
  x_2._entityKind = '\0';
  x_2._domain = '\0';
  x_2._country = 0;
  x_2._category = '\0';
  x_2._subcategory = '\0';
  x_2._specific = '\0';
  x_2._extra = '\0';
  while( true ) {
    uVar1 = x_2._8_8_;
    sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                      (&this->_silentAggregateSystemList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&this->_silentAggregateSystemList,x_2._8_8_);
    EntityType::EntityType((EntityType *)&idx_3,pvVar5);
    EntityType::marshal((EntityType *)&idx_3,dataStream);
    EntityType::~EntityType((EntityType *)&idx_3);
    x_2._8_8_ = x_2._8_8_ + 1;
  }
  x_3._entityKind = '\0';
  x_3._domain = '\0';
  x_3._country = 0;
  x_3._category = '\0';
  x_3._subcategory = '\0';
  x_3._specific = '\0';
  x_3._extra = '\0';
  while( true ) {
    uVar1 = x_3._8_8_;
    sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                      (&this->_silentEntitySystemList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&this->_silentEntitySystemList,x_3._8_8_);
    EntityType::EntityType((EntityType *)&idx_4,pvVar5);
    EntityType::marshal((EntityType *)&idx_4,dataStream);
    EntityType::~EntityType((EntityType *)&idx_4);
    x_3._8_8_ = x_3._8_8_ + 1;
  }
  sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                    (&this->_variableDatumList);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x_4._arrayLength = 0;
  x_4._44_4_ = 0;
  while( true ) {
    uVar1 = x_4._40_8_;
    sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatumList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar6 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatumList,x_4._40_8_);
    VariableDatum::VariableDatum((VariableDatum *)local_c0,pvVar6);
    VariableDatum::marshal((VariableDatum *)local_c0,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)local_c0);
    x_4._40_8_ = x_4._40_8_ + 1;
  }
  return;
}

Assistant:

void AggregateStatePdu::marshal(DataStream& dataStream) const
{
    EntityManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _aggregateID.marshal(dataStream);
    dataStream << _forceID;
    dataStream << _aggregateState;
    _aggregateType.marshal(dataStream);
    dataStream << _formation;
    _aggregateMarking.marshal(dataStream);
    _dimensions.marshal(dataStream);
    _orientation.marshal(dataStream);
    _centerOfMass.marshal(dataStream);
    _velocity.marshal(dataStream);
    dataStream << ( unsigned short )_aggregateIDList.size();
    dataStream << ( unsigned short )_entityIDList.size();
    dataStream << ( unsigned short )_silentAggregateSystemList.size();
    dataStream << ( unsigned short )_silentEntitySystemList.size();

     for(size_t idx = 0; idx < _aggregateIDList.size(); idx++)
     {
        AggregateID x = _aggregateIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _entityIDList.size(); idx++)
     {
        EntityID x = _entityIDList[idx];
        x.marshal(dataStream);
     }

    dataStream << _pad2;

     for(size_t idx = 0; idx < _silentAggregateSystemList.size(); idx++)
     {
        EntityType x = _silentAggregateSystemList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _silentEntitySystemList.size(); idx++)
     {
        EntityType x = _silentEntitySystemList[idx];
        x.marshal(dataStream);
     }

    dataStream << ( unsigned int )_variableDatumList.size();

     for(size_t idx = 0; idx < _variableDatumList.size(); idx++)
     {
        VariableDatum x = _variableDatumList[idx];
        x.marshal(dataStream);
     }

}